

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::NewFunction
          (ByteCodeWriter *this,RegSlot destinationRegister,uint index,bool isGenerator,
          RegSlot homeObjLocation)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value;
  RegSlot instance;
  undefined4 *puVar3;
  OpCode opcode;
  uint uVar4;
  uint32 local_40;
  RegSlot local_3c;
  RegSlot local_38;
  uint local_34;
  
  CheckOpen(this);
  if (destinationRegister != 0xffffffff) {
    local_34 = index;
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_008a293b;
      *puVar3 = 0;
    }
    uVar4 = local_34;
    value = FunctionBody::MapRegSlot(this->m_functionWrite,destinationRegister);
    if (isGenerator) {
      opcode = NewScGenFuncHomeObj;
      if (homeObjLocation == 0xffffffff) {
        opcode = NewScGenFunc;
      }
    }
    else if (((this->m_functionWrite->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) ==
             Flags_None) {
      opcode = (ushort)(homeObjLocation != 0xffffffff) * 3 + NewScFunc;
    }
    else {
      opcode = NewStackScFunc;
      if (homeObjLocation != 0xffffffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x911,"(!hasHomeObj)","!hasHomeObj");
        if (!bVar2) goto LAB_008a293b;
        *puVar3 = 0;
        uVar4 = local_34;
      }
    }
    bVar2 = OpCodeAttr::HasMultiSizeLayout(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x918,"(OpCodeAttr::HasMultiSizeLayout(opcode))",
                                  "OpCodeAttr::HasMultiSizeLayout(opcode)");
      if (!bVar2) goto LAB_008a293b;
      *puVar3 = 0;
      uVar4 = local_34;
    }
    local_3c = value;
    if (homeObjLocation == 0xffffffff) {
      bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,opcode,value,uVar4);
      if (bVar2) {
        return;
      }
      bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,opcode,value,uVar4);
      if (bVar2) {
        return;
      }
      local_40 = uVar4;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,opcode,this);
      uVar4 = 8;
    }
    else {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_008a293b;
        *puVar3 = 0;
        uVar4 = local_34;
      }
      instance = FunctionBody::MapRegSlot(this->m_functionWrite,homeObjLocation);
      bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,opcode,value,instance,uVar4);
      if (bVar2) {
        return;
      }
      bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,opcode,value,instance,uVar4);
      if (bVar2) {
        return;
      }
      local_40 = uVar4;
      local_38 = instance;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,opcode,this);
      uVar4 = 0xc;
    }
    Data::Write(&this->m_byteCodeData,&local_40,uVar4);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_008a293b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::NewFunction(RegSlot destinationRegister, uint index, bool isGenerator, RegSlot homeObjLocation)
    {
        CheckOpen();

        bool hasHomeObj = homeObjLocation != Js::Constants::NoRegister;
        destinationRegister = ConsumeReg(destinationRegister);
        OpCode opcode = OpCode::NewScFunc;
        if (isGenerator)
        {
            opcode = hasHomeObj ? OpCode::NewScGenFuncHomeObj : OpCode::NewScGenFunc;
        }
        else if (this->m_functionWrite->DoStackNestedFunc())
        {
            Assert(!hasHomeObj);
            opcode = OpCode::NewStackScFunc;
        }
        else if (hasHomeObj)
        {
            opcode = OpCode::NewScFuncHomeObj;
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(opcode));

        if (hasHomeObj)
        {
            homeObjLocation = ConsumeReg(homeObjLocation);
            MULTISIZE_LAYOUT_WRITE(ElementSlot, opcode, destinationRegister, homeObjLocation, index);
        }
        else
        {
            MULTISIZE_LAYOUT_WRITE(ElementSlotI1, opcode, destinationRegister, index);
        }
    }